

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O3

void anon_unknown.dwarf_dfd46::test_numerator_construction<long>(void)

{
  ResultBuilder *pRVar1;
  ResultBuilder __catchResult;
  int local_2f4;
  undefined1 local_2f0 [40];
  undefined8 local_2c8;
  ResultBuilder local_2c0;
  
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_2f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x26);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c0,"REQUIRE",(SourceLineInfo *)local_2f0,"r2.num() == 3",Normal,"");
  if ((ResultBuilder *)local_2f0._0_8_ != (ResultBuilder *)(local_2f0 + 0x10)) {
    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
  }
  local_2c8 = 3;
  local_2f4 = 3;
  local_2f0._0_8_ = &local_2c0;
  local_2f0._8_8_ = &local_2c8;
  pRVar1 = Catch::ExpressionLhs<long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<long_const&> *)local_2f0,&local_2f4);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c0);
  Catch::ResultBuilder::react(&local_2c0);
  Catch::ResultBuilder::~ResultBuilder(&local_2c0);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_2f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x27);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c0,"REQUIRE",(SourceLineInfo *)local_2f0,"r2.denom() == 1",Normal,"");
  if ((ResultBuilder *)local_2f0._0_8_ != (ResultBuilder *)(local_2f0 + 0x10)) {
    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
  }
  local_2c8 = 1;
  local_2f4 = 1;
  local_2f0._0_8_ = &local_2c0;
  local_2f0._8_8_ = &local_2c8;
  pRVar1 = Catch::ExpressionLhs<long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<long_const&> *)local_2f0,&local_2f4);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c0);
  Catch::ResultBuilder::react(&local_2c0);
  Catch::ResultBuilder::~ResultBuilder(&local_2c0);
  return;
}

Assistant:

void test_numerator_construction()
{
    using rational = tcb::rational<T>;

    constexpr rational r1 = 3;
    static_assert(r1.num() == 3, "");
    static_assert(r1.denom() == 1, "");

    const rational r2 = 3;
    REQUIRE(r2.num() == 3);
    REQUIRE(r2.denom() == 1);
}